

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.c
# Opt level: O0

Box * CreateBox(char *file,Size heapSize)

{
  Library *pLVar1;
  Box *box;
  Size heapSize_local;
  char *file_local;
  
  file_local = (char *)malloc(0x18);
  if ((long *)file_local == (long *)0x0) {
    file_local = (char *)0x0;
  }
  else {
    pLVar1 = CreateLibrary(file);
    *(Library **)file_local = pLVar1;
    if (*(long *)file_local == 0) {
      free(file_local);
      file_local = (char *)0x0;
    }
    else {
      *(long *)((long)file_local + 8) = 0;
      *(Size *)((long)file_local + 0x10) = heapSize;
    }
  }
  return (Box *)file_local;
}

Assistant:

Box *CreateBox(const char *file, Size heapSize)
{
    Box *box = malloc(sizeof(Box));
    if (!box)
    {
        return NULL;
    }
    box->library = CreateLibrary(file);
    if (!box->library)
    {
        free(box);
        return NULL;
    }
    box->heap = NULL;
    box->heapSize = heapSize;
    return box;
}